

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pt.hxx
# Opt level: O0

void P2Pt::multm3x3<double>(double (*m1) [3] [3],double (*m2) [3] [3],double (*output_m) [3])

{
  uint k;
  uint j;
  uint i;
  double (*output_m_local) [3];
  double (*m2_local) [3] [3];
  double (*m1_local) [3] [3];
  
  for (i = 0; i < 3; i = i + 1) {
    for (j = 0; j < 3; j = j + 1) {
      output_m[i][j] = 0.0;
      k = 0;
      while( true ) {
        if (2 < k) break;
        output_m[i][j] = (*m1)[i][k] * (*m2)[k][j] + output_m[i][j];
        k = k + 1;
      }
    }
  }
  return;
}

Assistant:

inline void
multm3x3(const T (&m1)[3][3], const T (&m2)[3][3], T output_m[][3])
{
	for (unsigned i = 0; i < 3; i++)
		for (unsigned j = 0; j < 3; j++) {
			output_m[i][j] = 0;
			for (unsigned k = 0; k < 3; k++)
				output_m[i][j] += m1[i][k] * m2[k][j];
		}
}